

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

bool __thiscall
PDA::inCombinations(PDA *this,vector<State_*,_std::allocator<State_*>_> *combination,
                   vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                   *combinations)

{
  pointer pvVar1;
  bool bVar2;
  pointer __x;
  vector<State_*,_std::allocator<State_*>_> possibleCombination;
  _Vector_base<State_*,_std::allocator<State_*>_> local_40;
  
  pvVar1 = (combinations->
           super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (combinations->
             super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<State_*,_std::allocator<State_*>_>::vector
              ((vector<State_*,_std::allocator<State_*>_> *)&local_40,__x);
    if (local_40._M_impl.super__Vector_impl_data._M_finish ==
        local_40._M_impl.super__Vector_impl_data._M_start) {
      std::_Vector_base<State_*,_std::allocator<State_*>_>::~_Vector_base(&local_40);
    }
    else {
      bVar2 = std::operator!=(&(*local_40._M_impl.super__Vector_impl_data._M_start)->name,
                              &(*(combination->super__Vector_base<State_*,_std::allocator<State_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->name);
      std::_Vector_base<State_*,_std::allocator<State_*>_>::~_Vector_base(&local_40);
      if (!bVar2) break;
    }
  }
  return __x != pvVar1;
}

Assistant:

bool PDA::inCombinations(std::vector<State *> combination, std::vector<std::vector<State *>> combinations) {
    for(auto possibleCombination: combinations){
        for (int i = 0; i < possibleCombination.size(); ++i) {
            if(possibleCombination[i]->getName() != combination[i]->getName()) {
                break;
            }
            return true;
        }
    }
    return false;
}